

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall DPolyAction::StopInterpolation(DPolyAction *this)

{
  DInterpolation *pDVar1;
  TObjPtr<DInterpolation> *obj;
  
  obj = &this->m_Interpolation;
  pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
  if (pDVar1 != (DInterpolation *)0x0) {
    pDVar1 = GC::ReadBarrier<DInterpolation>((DInterpolation **)obj);
    DInterpolation::DelRef(pDVar1,false);
    (obj->field_0).p = (DInterpolation *)0x0;
  }
  return;
}

Assistant:

void DPolyAction::StopInterpolation ()
{
	if (m_Interpolation != NULL)
	{
		m_Interpolation->DelRef();
		m_Interpolation = NULL;
	}
}